

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

M44d * Imath_3_2::procrustesRotationAndTranslation<double>
                 (M44d *__return_storage_ptr__,Vec3<double> *A,Vec3<double> *B,double *weights,
                 size_t numPoints,bool doScale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  double (*A_00) [3];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar19;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  M33d Qt;
  V3d S;
  M33d U;
  M33d C;
  M33d V;
  double local_178;
  double dStack_170;
  double local_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  Vec3<double> local_130;
  Matrix33<double> local_118;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  Matrix33<double> local_78;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar18 = ZEXT816(0);
    if (weights == (double *)0x0) {
      lVar4 = 0x10;
      auVar23 = ZEXT816(0);
      auVar21 = ZEXT816(0);
      sVar6 = numPoints;
      do {
        pdVar5 = (double *)((long)A + lVar4 + -0x10);
        dVar9 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + *pdVar5;
        auVar23._8_8_ = dVar9 + pdVar5[1];
        pdVar5 = (double *)((long)B + lVar4 + -0x10);
        dVar9 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + *pdVar5;
        auVar18._8_8_ = dVar9 + pdVar5[1];
        dVar9 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + *(double *)((long)&B->x + lVar4);
        auVar21._8_8_ = dVar9 + *(double *)((long)&A->x + lVar4);
        lVar4 = lVar4 + 0x18;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      auVar10._8_4_ = (int)(numPoints >> 0x20);
      auVar10._0_8_ = numPoints;
      auVar10._12_4_ = 0x45300000;
      dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar9 = 0.0;
      lVar4 = 2;
      sVar6 = 0;
      auVar23 = ZEXT816(0);
      auVar21 = ZEXT816(0);
      do {
        dVar17 = weights[sVar6];
        dVar9 = dVar9 + dVar17;
        pdVar5 = (double *)((long)A + lVar4 * 8 + -0x10);
        dVar19 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + *pdVar5 * dVar17;
        auVar23._8_8_ = dVar19 + pdVar5[1] * dVar17;
        pdVar5 = (double *)((long)B + lVar4 * 8 + -0x10);
        dVar19 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + *pdVar5 * dVar17;
        auVar18._8_8_ = dVar19 + pdVar5[1] * dVar17;
        dVar19 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + (&B->x)[lVar4] * dVar17;
        auVar21._8_8_ = dVar19 + (&A->x)[lVar4] * dVar17;
        sVar6 = sVar6 + 1;
        lVar4 = lVar4 + 3;
      } while (numPoints != sVar6);
    }
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      auVar1._8_8_ = dVar9;
      auVar1._0_8_ = dVar9;
      auVar23 = divpd(auVar23,auVar1);
      auVar2._8_8_ = dVar9;
      auVar2._0_8_ = dVar9;
      auVar18 = divpd(auVar18,auVar2);
      auVar3._8_8_ = dVar9;
      auVar3._0_8_ = dVar9;
      auVar21 = divpd(auVar21,auVar3);
      dVar24 = auVar21._8_8_;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      local_88 = 0.0;
      dVar20 = auVar21._0_8_;
      dVar22 = auVar23._0_8_;
      dVar9 = auVar23._8_8_;
      dVar17 = auVar18._0_8_;
      dVar19 = auVar18._8_8_;
      if (weights == (double *)0x0) {
        lVar4 = 0x10;
        local_b8 = 0.0;
        dStack_b0 = 0.0;
        local_a8 = 0.0;
        dStack_a0 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        sVar6 = numPoints;
        do {
          dVar12 = *(double *)((long)&B->x + lVar4) - dVar20;
          dVar13 = *(double *)((long)&A->x + lVar4) - dVar24;
          pdVar5 = (double *)((long)A + lVar4 + -0x10);
          dVar14 = *pdVar5 - dVar22;
          dVar11 = pdVar5[1] - dVar9;
          pdVar5 = (double *)((long)B + lVar4 + -0x10);
          dVar15 = *pdVar5 - dVar17;
          dVar16 = pdVar5[1] - dVar19;
          local_c8 = local_c8 + dVar15 * dVar14;
          dStack_c0 = dStack_c0 + dVar15 * dVar11;
          local_b8 = local_b8 + dVar13 * dVar15;
          dStack_b0 = dStack_b0 + dVar14 * dVar16;
          local_a8 = local_a8 + dVar11 * dVar16;
          dStack_a0 = dStack_a0 + dVar13 * dVar16;
          local_98 = local_98 + dVar12 * dVar14;
          dStack_90 = dStack_90 + dVar12 * dVar11;
          local_88 = local_88 + dVar13 * dVar12;
          lVar4 = lVar4 + 0x18;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      else {
        lVar4 = 2;
        sVar6 = 0;
        local_b8 = 0.0;
        dStack_b0 = 0.0;
        local_a8 = 0.0;
        dStack_a0 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        do {
          dVar14 = weights[sVar6];
          dVar11 = ((&B->x)[lVar4] - dVar20) * dVar14;
          dVar12 = (&A->x)[lVar4] - dVar24;
          pdVar5 = (double *)((long)A + lVar4 * 8 + -0x10);
          dVar15 = *pdVar5 - dVar22;
          dVar16 = pdVar5[1] - dVar9;
          pdVar5 = (double *)((long)B + lVar4 * 8 + -0x10);
          dVar13 = dVar14 * (*pdVar5 - dVar17);
          dVar14 = dVar14 * (pdVar5[1] - dVar19);
          local_c8 = local_c8 + dVar13 * dVar15;
          dStack_c0 = dStack_c0 + dVar13 * dVar16;
          local_b8 = local_b8 + dVar12 * dVar13;
          dStack_b0 = dStack_b0 + dVar15 * dVar14;
          local_a8 = local_a8 + dVar16 * dVar14;
          dStack_a0 = dStack_a0 + dVar12 * dVar14;
          local_98 = local_98 + dVar11 * dVar15;
          dStack_90 = dStack_90 + dVar11 * dVar16;
          local_88 = local_88 + dVar12 * dVar11;
          sVar6 = sVar6 + 1;
          lVar4 = lVar4 + 3;
        } while (numPoints != sVar6);
      }
      A_00 = (double (*) [3])&local_c8;
      local_118.x[0][0] = 1.0;
      local_118.x[0][1] = 0.0;
      local_118.x[0][2] = 0.0;
      local_118.x[1][0] = 0.0;
      local_118.x[1][1] = 1.0;
      local_118.x[1][2] = 0.0;
      local_118.x[2][0] = 0.0;
      local_118.x[2][1] = 0.0;
      local_118.x[2][2] = 1.0;
      local_78.x[0][0] = 1.0;
      local_78.x[0][1] = 0.0;
      local_78.x[0][2] = 0.0;
      local_78.x[1][0] = 0.0;
      local_78.x[1][1] = 1.0;
      local_78.x[1][2] = 0.0;
      local_78.x[2][0] = 0.0;
      local_78.x[2][1] = 0.0;
      local_78.x[2][2] = 1.0;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_118,&local_130,&local_78,
                        2.220446049250313e-16,true);
      local_178 = local_78.x[0][2] * local_118.x[0][2] +
                  local_78.x[0][0] * local_118.x[0][0] + local_78.x[0][1] * local_118.x[0][1];
      dStack_170 = local_78.x[0][2] * local_118.x[1][2] +
                   local_78.x[0][0] * local_118.x[1][0] + local_78.x[0][1] * local_118.x[1][1];
      local_168 = local_78.x[0][2] * local_118.x[2][2] +
                  local_78.x[0][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[0][1];
      local_160 = local_78.x[1][2] * local_118.x[0][2] +
                  local_78.x[1][0] * local_118.x[0][0] + local_78.x[1][1] * local_118.x[0][1];
      dStack_158 = local_78.x[1][2] * local_118.x[1][2] +
                   local_78.x[1][0] * local_118.x[1][0] + local_78.x[1][1] * local_118.x[1][1];
      local_150 = local_78.x[1][2] * local_118.x[2][2] +
                  local_78.x[1][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[1][1];
      local_148 = local_78.x[2][2] * local_118.x[0][2] +
                  local_78.x[2][0] * local_118.x[0][0] + local_78.x[2][1] * local_118.x[0][1];
      dStack_140 = local_78.x[2][2] * local_118.x[1][2] +
                   local_78.x[2][0] * local_118.x[1][0] + local_78.x[2][1] * local_118.x[1][1];
      local_138 = local_78.x[2][2] * local_118.x[2][2] +
                  local_78.x[2][0] * local_118.x[2][0] + local_118.x[2][1] * local_78.x[2][1];
      if (doScale && numPoints != 1) {
        if (weights == (double *)0x0) {
          pdVar5 = &A->z;
          dVar11 = 0.0;
          dVar14 = 0.0;
          do {
            dVar12 = ((Vec3<double> *)(pdVar5 + -2))->x - dVar22;
            dVar11 = ((*pdVar5 - dVar24) * (*pdVar5 - dVar24) +
                     dVar12 * dVar12 + (pdVar5[-1] - dVar9) * (pdVar5[-1] - dVar9)) - dVar11;
            dVar12 = dVar14 + dVar11;
            dVar11 = (dVar12 - dVar14) - dVar11;
            pdVar5 = pdVar5 + 3;
            numPoints = numPoints - 1;
            dVar14 = dVar12;
          } while (numPoints != 0);
        }
        else {
          pdVar5 = &A->z;
          sVar6 = 0;
          dVar11 = 0.0;
          dVar14 = 0.0;
          do {
            dVar12 = ((Vec3<double> *)(pdVar5 + -2))->x - dVar22;
            dVar11 = ((*pdVar5 - dVar24) * (*pdVar5 - dVar24) +
                     dVar12 * dVar12 + (pdVar5[-1] - dVar9) * (pdVar5[-1] - dVar9)) * weights[sVar6]
                     - dVar11;
            dVar12 = dVar14 + dVar11;
            dVar11 = (dVar12 - dVar14) - dVar11;
            sVar6 = sVar6 + 1;
            pdVar5 = pdVar5 + 3;
            dVar14 = dVar12;
          } while (numPoints != sVar6);
        }
        dVar14 = 0.0;
        pdVar5 = &local_178;
        lVar4 = 0;
        dVar11 = 0.0;
        do {
          lVar8 = 0;
          pdVar7 = pdVar5;
          dVar13 = dVar14;
          do {
            dVar11 = *pdVar7 * (*(double (*) [3])*A_00)[lVar8] - dVar11;
            dVar14 = dVar13 + dVar11;
            dVar11 = (dVar14 - dVar13) - dVar11;
            lVar8 = lVar8 + 1;
            pdVar7 = pdVar7 + 3;
            dVar13 = dVar14;
          } while (lVar8 != 3);
          lVar4 = lVar4 + 1;
          A_00 = A_00 + 1;
          pdVar5 = pdVar5 + 1;
        } while (lVar4 != 3);
        dVar14 = dVar14 / dVar12;
      }
      else {
        dVar14 = 1.0;
      }
      dVar22 = dVar22 * dVar14;
      dVar9 = dVar9 * dVar14;
      dVar24 = dVar24 * dVar14;
      __return_storage_ptr__->x[0][0] = local_178 * dVar14;
      __return_storage_ptr__->x[0][1] = dStack_170 * dVar14;
      __return_storage_ptr__->x[0][2] = local_168 * dVar14;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = local_160 * dVar14;
      __return_storage_ptr__->x[1][1] = dStack_158 * dVar14;
      __return_storage_ptr__->x[1][2] = local_150 * dVar14;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = dVar14 * local_148;
      __return_storage_ptr__->x[2][1] = dVar14 * dStack_140;
      __return_storage_ptr__->x[2][2] = local_138 * dVar14;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           dVar17 - (dVar24 * local_148 + dVar22 * local_178 + dVar9 * local_160);
      __return_storage_ptr__->x[3][1] =
           dVar19 - (dVar24 * dStack_140 + dVar22 * dStack_170 + dVar9 * dStack_158);
      __return_storage_ptr__->x[3][2] =
           dVar20 - (dVar24 * local_138 + dVar22 * local_168 + local_150 * dVar9);
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}